

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

uint64_t kmer_reverse(uint64_t kmer,uint8_t k)

{
  ulong uVar1;
  uint64_t nuc;
  int pos;
  uint64_t rkmer;
  uint64_t old_kmer;
  uint8_t k_local;
  uint64_t kmer_local;
  
  rkmer = 0;
  old_kmer = kmer;
  for (pos = 0; pos < (int)(uint)k; pos = pos + 1) {
    uVar1 = old_kmer & 3;
    old_kmer = old_kmer >> 2;
    rkmer = (3 - uVar1) + rkmer * 4;
  }
  return rkmer;
}

Assistant:

uint64_t kmer_reverse(uint64_t kmer, uint8_t k) {
    uint64_t old_kmer=kmer;
    uint64_t rkmer=0;
    for (int pos=0;pos<k;++pos) {
        //std::cout<<"kmer: "
        //3->0 T->A     2->1 G C     1->2
        uint64_t nuc=3-(old_kmer%4);
        old_kmer>>=2;
        //std::cout<<"rc adding "<<nuc<<std::endl;
        rkmer<<=2;
        rkmer+=nuc;
    }
    return rkmer;
}